

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O1

void __thiscall
vkt::ssbo::anon_unknown_0::BlockMultiNestedStructCase::BlockMultiNestedStructCase
          (BlockMultiNestedStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  ShaderInterface *this_00;
  vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> *pvVar1;
  StructType *this_01;
  StructType *this_02;
  BufferBlock *pBVar2;
  VarType local_90;
  BufferVar local_78;
  BufferBlock *local_38;
  
  SSBOLayoutCase::SSBOLayoutCase(&this->super_SSBOLayoutCase,testCtx,name,"",flagsB,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00d5f880;
  this->m_flagsA = (deUint32)description;
  this->m_flagsB = flagsA;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_MAT3,PRECISION_LOWP);
  glu::StructType::addMember(this_01,"a",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType(&local_90,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_78,&local_90,4);
  glu::StructType::addMember(this_01,"b",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"c",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  this_02 = ShaderInterface::allocStruct(this_00,"T");
  glu::VarType::VarType((VarType *)&local_78,TYPE_UINT,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType((VarType *)&local_78,this_01);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  glu::VarType::VarType((VarType *)&local_78,TYPE_BOOL_VEC4,PRECISION_LAST);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_78);
  glu::VarType::~VarType((VarType *)&local_78);
  pBVar2 = ShaderInterface::allocBlock(this_00,"BlockA");
  glu::VarType::VarType(&local_90,TYPE_FLOAT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_78,"a",&local_90,0x600);
  pvVar1 = &pBVar2->m_variables;
  local_38 = pBVar2;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,this_01);
  BufferVar::BufferVar(&local_78,"b",&local_90,0x400);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_UINT_VEC3,PRECISION_LOWP);
  BufferVar::BufferVar(&local_78,"c",&local_90,0);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  pBVar2 = local_38;
  std::__cxx11::string::_M_replace
            ((ulong)&local_38->m_instanceName,0,(char *)(local_38->m_instanceName)._M_string_length,
             0xb5bb92);
  pBVar2->m_flags = this->m_flagsA;
  pBVar2 = ShaderInterface::allocBlock(this_00,"BlockB");
  glu::VarType::VarType(&local_90,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_78,"a",&local_90,0x400);
  pvVar1 = &pBVar2->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,this_02);
  BufferVar::BufferVar(&local_78,"b",&local_90,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_BOOL_VEC4,PRECISION_LAST);
  BufferVar::BufferVar(&local_78,"c",&local_90,0);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  glu::VarType::VarType(&local_90,TYPE_BOOL,PRECISION_LAST);
  BufferVar::BufferVar(&local_78,"d",&local_90,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_78);
  glu::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90);
  std::__cxx11::string::_M_replace
            ((ulong)&pBVar2->m_instanceName,0,(char *)(pBVar2->m_instanceName)._M_string_length,
             0xb5bba0);
  pBVar2->m_flags = this->m_flagsB;
  if (0 < this->m_numInstances) {
    BufferBlock::setArraySize(local_38,this->m_numInstances);
    BufferBlock::setArraySize(pBVar2,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockMultiNestedStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_flagsA			(flagsA)
		, m_flagsB			(flagsB)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_LOWP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP)); // \todo [pyry] UNUSED
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST));

		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(&typeS), ACCESS_WRITE));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}

		init();
	}